

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

precise_unit units::unit_from_string(string *unit_string,uint64_t match_flags)

{
  precise_unit pVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string(&local_30,unit_string);
  pVar1 = unit_from_string_internal(&local_30,match_flags & 0xffffffefffffffff);
  std::__cxx11::string::~string((string *)&local_30);
  return pVar1;
}

Assistant:

precise_unit
    unit_from_string(std::string unit_string, std::uint64_t match_flags)
{
    // always allow the code replacements on first run
    match_flags &= (~skip_code_replacements);
    return unit_from_string_internal(std::move(unit_string), match_flags);
}